

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O2

int Acb_NtkCheckPiOrder(Acb_Ntk_t *pNtkF,Acb_Ntk_t *pNtkG)

{
  int iVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  int i;
  int iVar3;
  
  iVar1 = (pNtkF->vCis).nSize;
  iVar3 = 0;
  i = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
    i = 0;
  }
  do {
    if (iVar3 == i) {
LAB_00337a21:
      if (iVar3 == iVar1) {
        puts("Networks have the same PI names.");
      }
      return (int)(iVar3 == iVar1);
    }
    iVar2 = Vec_IntEntry(&pNtkF->vCis,i);
    __s1 = Acb_ObjNameStr(pNtkF,iVar2);
    iVar2 = Vec_IntEntry(&pNtkG->vCis,i);
    __s2 = Acb_ObjNameStr(pNtkG,iVar2);
    iVar2 = strcmp(__s1,__s2);
    if (iVar2 != 0) {
      puts("Networks have different PI names. Reordering PIs of the implementation network.");
      Acb_NtkUpdateCiOrder(pNtkF,pNtkG);
      iVar3 = i;
      goto LAB_00337a21;
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Acb_NtkCheckPiOrder( Acb_Ntk_t * pNtkF, Acb_Ntk_t * pNtkG )
{
    int i, nPis = Acb_NtkCiNum(pNtkF);
    for ( i = 0; i < nPis; i++ )
    {
        char * pNameF = Acb_ObjNameStr( pNtkF, Acb_NtkCi(pNtkF, i) );
        char * pNameG = Acb_ObjNameStr( pNtkG, Acb_NtkCi(pNtkG, i) );
        if ( strcmp(pNameF, pNameG) )
        {
//            printf( "PI %d has different names (%s and %s) in these networks.\n", i, pNameF, pNameG );
            printf( "Networks have different PI names. Reordering PIs of the implementation network.\n" );
            Acb_NtkUpdateCiOrder( pNtkF, pNtkG );
            break;
        }
    }
    if ( i == nPis )
        printf( "Networks have the same PI names.\n" );
    return i == nPis;
}